

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

bool __thiscall hwnet::util::TimerMgr::insert(TimerMgr *this,Ptr *e)

{
  value_type pTVar1;
  size_type sVar2;
  element_type *peVar3;
  reference ppTVar4;
  element_type *peVar5;
  size_type sVar6;
  size_t sVar7;
  size_t offset;
  size_t local_28;
  size_t offsetIdx;
  Ptr *e_local;
  TimerMgr *this_local;
  
  offsetIdx = (size_t)e;
  e_local = &this->empty_element_ptr;
  peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)e);
  if ((peVar3->mMgr != (TimerMgr *)0x0) &&
     (peVar3 = std::
               __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)offsetIdx), peVar3->mMgr != this)) {
    return false;
  }
  peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)offsetIdx);
  if (peVar3->mIndex == 0) {
    peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)offsetIdx);
    peVar3->mMgr = this;
    sVar7 = this->elements_size;
    peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)offsetIdx);
    peVar3->mIndex = sVar7 + 1;
    sVar2 = this->elements_size;
    sVar6 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::size
                      (&this->elements);
    if (sVar2 == sVar6) {
      offset = (size_t)std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::get
                                 ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)
                                  offsetIdx);
      std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::push_back
                (&this->elements,(value_type *)&offset);
    }
    else {
      sVar7 = getNextFreeOffset(this);
      peVar5 = std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)offsetIdx)
      ;
      ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                          (&this->elements,sVar7);
      *ppTVar4 = peVar5;
    }
    this->elements_size = this->elements_size + 1;
    peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)offsetIdx);
    up(this,peVar3->mIndex);
    sVar7 = offsetIdx;
    peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)offsetIdx);
    std::shared_ptr<hwnet::util::Timer>::operator=
              (&peVar3->selfPtr,(shared_ptr<hwnet::util::Timer> *)sVar7);
    this_local._7_1_ = true;
  }
  else {
    peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)offsetIdx);
    if (this->elements_size < peVar3->mIndex) {
      this_local._7_1_ = false;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)offsetIdx);
      local_28 = getOffset(this,peVar3->mIndex);
      ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::operator[]
                          (&this->elements,local_28);
      pTVar1 = *ppTVar4;
      peVar5 = std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)offsetIdx)
      ;
      if (pTVar1 == peVar5) {
        peVar5 = std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)
                            offsetIdx);
        change(this,peVar5);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool insert(Timer::Ptr &e) {

		if(e->mMgr != nullptr && e->mMgr != this) {
			return false;
		}

		if(e->mIndex > 0) {
			if(e->mIndex > this->elements_size) {
				return false;
			}
			auto offsetIdx = getOffset(e->mIndex);
			if(this->elements[offsetIdx] != e.get()) {
				return false;
			}
			change(e.get());
			return true;
		} else {
			e->mMgr = this;
			e->mIndex = this->elements_size+1;
			if(this->elements_size == this->elements.size()) {
				this->elements.push_back(e.get());
			} else {
				auto offset = getNextFreeOffset();
				this->elements[offset] = e.get();
			}
			++this->elements_size;
			this->up(e->mIndex);
			e->selfPtr = e;
			return true;
		}
	}